

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZmqComms.cpp
# Opt level: O3

void __thiscall helics::zeromq::ZmqComms::~ZmqComms(ZmqComms *this)

{
  CommsInterface::disconnect((CommsInterface *)this);
  (this->super_NetworkCommsInterface).super_CommsInterface._vptr_CommsInterface =
       (_func_int **)&PTR__NetworkCommsInterface_004d6e68;
  CLI::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&(this->super_NetworkCommsInterface).openPorts.hosts);
  std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  ::~_Rb_tree(&(this->super_NetworkCommsInterface).openPorts.nextPorts._M_t);
  std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  ::~_Rb_tree(&(this->super_NetworkCommsInterface).openPorts.usedPort._M_t);
  CommsInterface::~CommsInterface((CommsInterface *)this);
  return;
}

Assistant:

ZmqComms::~ZmqComms()
{
    disconnect();
}